

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> * __thiscall
TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_>::PopItem
          (TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *__return_storage_ptr__,
          TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstruct<float>_> *this)

{
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecondV2SubData
            (__return_storage_ptr__);
  std::mutex::lock(&this->fAccessLock);
  if ((this->fWork).
      super__List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>::operator=
              (__return_storage_ptr__,
               (TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_> *)
               ((this->fWork).
                super__List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::
    list<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstruct<float>_>_>_>
    ::pop_front(&this->fWork);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

TPZDohrPrecondV2SubData<TVar, TSubStruct> PopItem()
	{
		TPZDohrPrecondV2SubData<TVar, TSubStruct> result;
        std::lock_guard<std::mutex> lock(fAccessLock);
		if (fWork.size()) {
			result = *fWork.begin();
			fWork.pop_front();
		}
		return result;
	}